

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::EnumFieldGenerator::GenerateParsingCode
          (EnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Descriptor *descriptor;
  Printer *printer_local;
  EnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "int rawValue = input.readEnum();\n$type$ value = $type$.valueOf(rawValue);\n")
  ;
  descriptor = FieldDescriptor::containing_type(this->descriptor_);
  bVar1 = HasUnknownFields(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (value == null) {\n  unknownFields.mergeVarintField($number$, rawValue);\n} else {\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,"if (value != null) {\n");
  }
  io::Printer::Print(printer,&this->variables_,
                     "  $set_has_field_bit_message$;\n  $name$_ = value;\n}\n");
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "int rawValue = input.readEnum();\n"
    "$type$ value = $type$.valueOf(rawValue);\n");
  if (HasUnknownFields(descriptor_->containing_type())) {
    printer->Print(variables_,
      "if (value == null) {\n"
      "  unknownFields.mergeVarintField($number$, rawValue);\n"
      "} else {\n");
  } else {
    printer->Print(variables_,
      "if (value != null) {\n");
  }
  printer->Print(variables_,
    "  $set_has_field_bit_message$;\n"
    "  $name$_ = value;\n"
    "}\n");
}